

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_OverlayOffset(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  bool bVar1;
  bool local_6a;
  bool local_67;
  int local_64;
  double dStack_60;
  int flags;
  double wy;
  double wx;
  int layer;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x3ea,"int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    self_00 = (AActor *)(param->field_0).field_1.a;
    local_67 = true;
    if (self_00 != (AActor *)0x0) {
      local_67 = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_67 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x3ea,"int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
        bVar1 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3ea,
                      "int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_6a = true;
      if (this != (DObject *)0x0) {
        local_6a = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_6a == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3ea,
                      "int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
        bVar1 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3ea,
                      "int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
      wx._4_4_ = 1;
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3eb,
                      "int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      wx._4_4_ = param[3].field_0.i;
    }
    if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
      wy = 0.0;
    }
    else {
      if (param[4].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3ec,
                      "int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      wy = param[4].field_0.f;
    }
    if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
      dStack_60 = 32.0;
    }
    else {
      if (param[5].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3ed,
                      "int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      dStack_60 = param[5].field_0.f;
    }
    if ((numparam < 7) || (param[6].field_0.field_3.Type == 0xff)) {
      local_64 = 0;
    }
    else {
      if (param[6].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x3ee,
                      "int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      local_64 = param[6].field_0.i;
    }
    A_OverlayOffset(self_00,wx._4_4_,wy,dStack_60,local_64);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x3ea,"int AF_A_OverlayOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_OverlayOffset)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(layer)	{ layer = PSP_WEAPON; }
	PARAM_FLOAT_OPT(wx)		{ wx = 0.; }
	PARAM_FLOAT_OPT(wy)		{ wy = 32.; }
	PARAM_INT_OPT(flags)	{ flags = 0; }
	A_OverlayOffset(self, layer, wx, wy, flags);
	return 0;
}